

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fileWriterWrite(FileWriter *p,u8 *pData,int nData)

{
  int iVar1;
  bool bVar2;
  int local_24;
  int local_20;
  int nCopy;
  int nRem;
  int nData_local;
  u8 *pData_local;
  FileWriter *p_local;
  
  local_20 = nData;
  while( true ) {
    bVar2 = false;
    if (0 < local_20) {
      bVar2 = p->eFWErr == 0;
    }
    if (!bVar2) break;
    local_24 = local_20;
    if (p->nBuffer - p->iBufEnd < local_20) {
      local_24 = p->nBuffer - p->iBufEnd;
    }
    memcpy(p->aBuffer + p->iBufEnd,pData + (nData - local_20),(long)local_24);
    p->iBufEnd = local_24 + p->iBufEnd;
    if (p->iBufEnd == p->nBuffer) {
      iVar1 = sqlite3OsWrite(p->pFile,p->aBuffer + p->iBufStart,p->iBufEnd - p->iBufStart,
                             p->iWriteOff + (long)p->iBufStart);
      p->eFWErr = iVar1;
      p->iBufEnd = 0;
      p->iBufStart = 0;
      p->iWriteOff = (long)p->nBuffer + p->iWriteOff;
    }
    local_20 = local_20 - local_24;
  }
  return;
}

Assistant:

static void fileWriterWrite(FileWriter *p, u8 *pData, int nData){
  int nRem = nData;
  while( nRem>0 && p->eFWErr==0 ){
    int nCopy = nRem;
    if( nCopy>(p->nBuffer - p->iBufEnd) ){
      nCopy = p->nBuffer - p->iBufEnd;
    }

    memcpy(&p->aBuffer[p->iBufEnd], &pData[nData-nRem], nCopy);
    p->iBufEnd += nCopy;
    if( p->iBufEnd==p->nBuffer ){
      p->eFWErr = sqlite3OsWrite(p->pFile, 
          &p->aBuffer[p->iBufStart], p->iBufEnd - p->iBufStart, 
          p->iWriteOff + p->iBufStart
      );
      p->iBufStart = p->iBufEnd = 0;
      p->iWriteOff += p->nBuffer;
    }
    assert( p->iBufEnd<p->nBuffer );

    nRem -= nCopy;
  }
}